

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Callbacks>::
insert<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Entry,unsigned_int&>
          (HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Callbacks> *this,
          ArrayPtr<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> table,
          size_t pos,uint *params)

{
  int iVar1;
  uint uVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar3;
  ulong uVar4;
  uint uVar5;
  size_t sVar6;
  HashBucket *pHVar7;
  uint hash;
  HashIndex<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Callbacks> *this_00;
  ulong targetSize;
  int *in_R9;
  HashBucket *pHVar8;
  Maybe<unsigned_long> MVar9;
  
  this_00 = (HashIndex<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Callbacks> *)
            table.ptr;
  sVar6 = (this_00->buckets).size_;
  uVar4 = sVar6 * 2;
  if (uVar4 < (this_00->erasedCount + pos) * 3 + 3) {
    targetSize = pos * 2 + 2;
    if (targetSize < uVar4) {
      targetSize = uVar4;
    }
    HashIndex<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Callbacks>::rehash
              (this_00,targetSize);
    sVar6 = (this_00->buckets).size_;
  }
  iVar1 = *in_R9;
  hash = (uint)(iVar1 != 0);
  uVar5 = _::chooseBucket(hash,(uint)sVar6);
  aVar3 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)(this_00->buckets).ptr;
  pHVar7 = (HashBucket *)0x0;
  do {
    pHVar8 = (HashBucket *)(aVar3.value + (ulong)uVar5 * 8);
    uVar2 = pHVar8->value;
    if (uVar2 == 1) {
      if (pHVar7 == (HashBucket *)0x0) {
        pHVar7 = pHVar8;
      }
    }
    else {
      if (uVar2 == 0) {
        if (pHVar7 != (HashBucket *)0x0) {
          this_00->erasedCount = this_00->erasedCount - 1;
          pHVar8 = pHVar7;
        }
        *pHVar8 = (HashBucket)(((ulong)(iVar1 != 0) | (long)params << 0x20) + 0x200000000);
        *this = (HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Callbacks>)
                0x0;
        goto LAB_001acf5b;
      }
      if ((pHVar8->hash == hash) && (*(int *)(table.size_ + (ulong)(uVar2 - 2) * 0x18) == *in_R9)) {
        *this = (HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Callbacks>)
                0x1;
        *(ulong *)(this + 8) = (ulong)(uVar2 - 2);
LAB_001acf5b:
        MVar9.ptr.field_1.value = aVar3.value;
        MVar9.ptr._0_8_ = this;
        return (Maybe<unsigned_long>)MVar9.ptr;
      }
    }
    sVar6 = (ulong)uVar5 + 1;
    uVar5 = (uint)sVar6;
    if (sVar6 == (this_00->buckets).size_) {
      uVar5 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash.
      rehash(kj::max(buckets.size() * 2, (table.size() + 1) * 2));
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_MAYBE(s, erasedSlot) {
          --erasedCount;
          *s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return nullptr;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == nullptr) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }